

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitBrIf(WasmBytecodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  WasmBinaryReader *pWVar4;
  EmitInfo EVar5;
  BlockInfo *pBVar6;
  undefined4 *puVar7;
  ulong uVar8;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 aVar9;
  uint32 uVar10;
  PolymorphicEmitInfo *this_00;
  PolymorphicEmitInfo polyExpr;
  PolymorphicEmitInfo PVar11;
  PolymorphicEmitInfo PVar12;
  EmitInfo local_60;
  EmitInfo conditionInfo;
  PolymorphicEmitInfo local_50;
  EmitInfo local_40;
  BlockInfo *local_38;
  
  pWVar4 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar4 == (WasmBinaryReader *)0x0) {
    pWVar4 = (this->m_module->m_reader).ptr;
  }
  uVar10 = (pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  EVar5 = PopEvalStack(this,FirstLocalType,L"br_if condition must have i32 type");
  local_60 = EVar5;
  ReleaseLocation(this,&local_60);
  pBVar6 = GetBlockInfo(this,uVar10);
  uVar3 = (pBVar6->yieldInfo).count;
  PVar11._4_4_ = 0;
  PVar11.count = uVar3;
  if (uVar3 == 0) {
    uVar8 = 0;
    aVar9.infos = (EmitInfo *)0x0;
  }
  else {
    PVar11.field_1.infos = (pBVar6->yieldInfo).field_1.infos;
    PVar11 = PopStackPolymorphic(this,PVar11,(char16 *)0x0);
    aVar9 = PVar11.field_1;
    uVar3 = PVar11.count;
    polyExpr._4_4_ = 0;
    polyExpr.count = uVar3;
    polyExpr.field_1.infos = aVar9.infos;
    local_50.count = uVar3;
    local_50.field_1 = aVar9;
    local_38 = pBVar6;
    YieldToBlock(this,pBVar6,polyExpr);
    pBVar6 = local_38;
    if (uVar3 != 1) {
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          if (aVar9.infos[uVar8].type == Any) goto LAB_00f20e1f;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      uVar8 = (ulong)uVar3;
      goto LAB_00f20f36;
    }
    uVar8 = 1;
    if (PVar11.field_1._4_4_ != 8) goto LAB_00f20f36;
LAB_00f20e1f:
    local_40 = EVar5;
    if (this->isUnreachable == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x6f0,"(IsUnreachable())","IsUnreachable()");
      if (!bVar2) goto LAB_00f20f67;
      *puVar7 = 0;
    }
    this_00 = &local_38->yieldInfo;
    if (uVar3 != this_00->count) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x6f1,"(info.Count() == blockInfo->yieldInfo.Count())",
                         "info.Count() == blockInfo->yieldInfo.Count()");
      if (!bVar2) {
LAB_00f20f67:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    if (uVar3 == 0) {
      uVar8 = 0;
      pBVar6 = local_38;
      EVar5 = local_40;
    }
    else {
      uVar10 = 0;
      conditionInfo = (EmitInfo)this;
      do {
        EVar5 = PolymorphicEmitInfo::GetInfo(this_00,uVar10);
        PolymorphicEmitInfo::SetInfo(&local_50,(EmitInfo)((ulong)EVar5 | 0xffffffff),uVar10);
        uVar10 = uVar10 + 1;
        uVar8 = (ulong)local_50.count;
        this = (WasmBytecodeGenerator *)conditionInfo;
        aVar9 = local_50.field_1;
        pBVar6 = local_38;
        EVar5 = local_40;
      } while (uVar10 < local_50.count);
    }
  }
LAB_00f20f36:
  (*(*(IWasmByteCodeWriter **)((long)this + 0xb8))->_vptr_IWasmByteCodeWriter[0x1a])
            (*(IWasmByteCodeWriter **)((long)this + 0xb8),0x26,(ulong)(uint)pBVar6->label,
             (ulong)EVar5 & 0xffffffff);
  PVar12.field_1.infos = aVar9.infos;
  PVar12._0_8_ = uVar8;
  return PVar12;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitBrIf()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("br_if condition must have i32 type"));
    ReleaseLocation(&conditionInfo);

    PolymorphicEmitInfo info;
    BlockInfo* blockInfo = GetBlockInfo(depth);

    if (blockInfo->HasYield())
    {
        info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        if (info.IsUnreachable())
        {
            Assert(IsUnreachable());
            Assert(info.Count() == blockInfo->yieldInfo.Count());
            // Use the block's yield type to continue type check
            for (uint32 i = 0; i < info.Count(); ++i)
            {
                info.SetInfo(EmitInfo(blockInfo->yieldInfo.GetInfo(i).type), i);
            }
        }
    }

    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrTrue_Int, blockInfo->label, conditionInfo.location);

    return info;
}